

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort_test.c
# Opt level: O2

int main(void)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_INT RVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  REF_INT position;
  REF_INT m;
  REF_INT sorted_index [7];
  REF_INT sorted [4];
  REF_GLOB global [4];
  int in_stack_ffffffffffc2f720;
  int in_stack_ffffffffffc2f724;
  
  global[0] = 0x200000001;
  global[1] = 0x400000003;
  uVar2 = ref_sort_insertion_int(4,(REF_INT *)global,sorted);
  if (uVar2 != 0) {
    uVar7 = (ulong)uVar2;
    pcVar9 = "sort";
    uVar12 = 0x22;
    goto LAB_001011bd;
  }
  if (sorted[0] == 1) {
    if (sorted[1] != 2) {
      pcVar9 = "sorted[1]";
      uVar12 = 0x24;
LAB_0010129b:
      uVar13 = 2;
      goto LAB_001012ee;
    }
    if (sorted[2] == 3) {
      if (sorted[3] != 4) {
        uVar12 = 0x26;
LAB_001012e9:
        pcVar9 = "sorted[3]";
        uVar13 = 4;
        goto LAB_001012ee;
      }
      global[0] = 0x300000004;
      global[1] = 0x100000002;
      uVar2 = ref_sort_insertion_int(4,(REF_INT *)global,sorted);
      if (uVar2 != 0) {
        uVar7 = (ulong)uVar2;
        pcVar9 = "sort";
        uVar12 = 0x2f;
        goto LAB_001011bd;
      }
      if (sorted[0] != 1) {
        pcVar9 = "sorted[0]";
        uVar12 = 0x30;
        goto LAB_00101274;
      }
      if (sorted[1] != 2) {
        pcVar9 = "sorted[1]";
        uVar12 = 0x31;
        goto LAB_0010129b;
      }
      if (sorted[2] == 3) {
        if (sorted[3] != 4) {
          uVar12 = 0x33;
          goto LAB_001012e9;
        }
        global[0] = 0x100000002;
        global[1] = 0x300000004;
        uVar2 = ref_sort_insertion_int(4,(REF_INT *)global,sorted);
        if (uVar2 != 0) {
          uVar7 = (ulong)uVar2;
          pcVar9 = "sort";
          uVar12 = 0x3c;
          goto LAB_001011bd;
        }
        if (sorted[0] != 1) {
          pcVar9 = "sorted[0]";
          uVar12 = 0x3d;
          goto LAB_00101274;
        }
        if (sorted[1] != 2) {
          pcVar9 = "sorted[1]";
          uVar12 = 0x3e;
          goto LAB_0010129b;
        }
        if (sorted[2] == 3) {
          if (sorted[3] != 4) {
            uVar12 = 0x40;
            goto LAB_001012e9;
          }
          global[0] = 0x100000002;
          global[1] = 0x300000002;
          uVar2 = ref_sort_unique_int(4,(REF_INT *)global,&m,sorted);
          if (uVar2 != 0) {
            uVar7 = (ulong)uVar2;
            pcVar9 = "unique";
            uVar12 = 0x49;
            goto LAB_001011bd;
          }
          if (m == 3) {
            if (sorted[0] != 1) {
              pcVar9 = "unique[0]";
              uVar12 = 0x4b;
              goto LAB_00101274;
            }
            if (sorted[1] != 2) {
              pcVar9 = "unique[1]";
              uVar12 = 0x4c;
              goto LAB_0010129b;
            }
            if (sorted[2] == 3) {
              global[0] = 0x100000000;
              global[1] = 0x300000002;
              sorted[0] = 3;
              sorted[1] = 2;
              sorted[2] = 1;
              sorted[3] = 0;
              uVar2 = ref_sort_same(4,(REF_INT *)global,sorted,&m);
              if (uVar2 != 0) {
                uVar7 = (ulong)uVar2;
                pcVar9 = "same";
                uVar12 = 0x5c;
                goto LAB_001011bd;
              }
              if (m == 0) {
                uVar12 = 0x5d;
LAB_00101701:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                       ,uVar12,"main","same");
                return 1;
              }
              global[0] = 0x700000004;
              global[1] = 0x500000006;
              sorted[0] = 4;
              sorted[1] = 7;
              sorted[2] = 6;
              sorted[3] = 5;
              uVar2 = ref_sort_same(4,(REF_INT *)global,sorted,&m);
              if (uVar2 != 0) {
                uVar7 = (ulong)uVar2;
                pcVar9 = "same";
                uVar12 = 0x6b;
                goto LAB_001011bd;
              }
              if (m == 0) {
                uVar12 = 0x6c;
                goto LAB_00101701;
              }
              global[0] = 0x100000000;
              global[1] = 0x300000002;
              sorted[0] = 3;
              sorted[1] = 2;
              sorted[2] = 1;
              sorted[3] = 3;
              uVar2 = ref_sort_same(4,(REF_INT *)global,sorted,&m);
              if (uVar2 != 0) {
                uVar7 = (ulong)uVar2;
                pcVar9 = "same";
                uVar12 = 0x7b;
                goto LAB_001011bd;
              }
              if (m != 0) {
                uVar12 = 0x7c;
                goto LAB_00101701;
              }
              global[0] = 0x100000000;
              global[1] = 0x300000002;
              sorted[0] = 3;
              sorted[1] = 2;
              sorted[2] = 1;
              sorted[3] = 5;
              uVar2 = ref_sort_same(4,(REF_INT *)global,sorted,&m);
              if (uVar2 != 0) {
                uVar7 = (ulong)uVar2;
                pcVar9 = "same";
                uVar12 = 0x8b;
                goto LAB_001011bd;
              }
              if (m != 0) {
                uVar12 = 0x8c;
                goto LAB_00101701;
              }
              global[0] = 10;
              global[1] = -1;
              global[2] = 0x1e;
              global[3] = -1;
              uVar2 = 0;
              for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
                if (global[lVar6] != -1) {
                  *(REF_GLOB *)(sorted + (long)(int)uVar2 * 2) = global[lVar6];
                  (&m)[(int)uVar2] = (REF_INT)lVar6;
                  uVar2 = uVar2 + 1;
                }
              }
              uVar3 = ref_sort_heap_glob(uVar2,(REF_GLOB *)sorted,sorted_index);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar9 = "sort";
                uVar12 = 0xa2;
LAB_001011bd:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                       ,uVar12,"main",uVar7,pcVar9);
                return (int)uVar7;
              }
              uVar7 = 0;
              uVar8 = 0;
              if (0 < (int)uVar2) {
                uVar8 = (ulong)uVar2;
              }
              for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
                iVar10 = (&m)[sorted_index[uVar7]];
                sorted_index[uVar7] = iVar10;
                *(REF_GLOB *)(sorted + uVar7 * 2) = global[iVar10];
              }
              uVar3 = ref_sort_search_glob(uVar2,(REF_GLOB *)sorted,10,&position);
              if (uVar3 != 0) {
                uVar7 = (ulong)uVar3;
                pcVar9 = "search";
                uVar12 = 0xa8;
                goto LAB_001011bd;
              }
              if (sorted_index[position] == 0) {
                uVar3 = ref_sort_search_glob(uVar2,(REF_GLOB *)sorted,0x1e,&position);
                if (uVar3 != 0) {
                  uVar7 = (ulong)uVar3;
                  pcVar9 = "search";
                  uVar12 = 0xab;
                  goto LAB_001011bd;
                }
                if (sorted_index[position] != 2) {
                  pcVar9 = "2";
                  uVar13 = 2;
                  uVar12 = 0xac;
                  goto LAB_001012ee;
                }
                uVar2 = ref_sort_search_glob(uVar2,(REF_GLOB *)sorted,0x14,&position);
                if (uVar2 != 0) {
                  uVar7 = (ulong)uVar2;
                  pcVar9 = "search";
                  uVar12 = 0xae;
                  goto LAB_001011bd;
                }
                if (sorted_index[position] != 5) {
                  pcVar9 = "5";
                  uVar13 = 5;
                  uVar12 = 0xaf;
                  goto LAB_001012ee;
                }
                global[0] = 0x28;
                global[1] = 10;
                global[2] = 0x1e;
                global[3] = 0x14;
                uVar2 = ref_sort_heap_glob(4,global,&m);
                if (uVar2 != 0) {
                  uVar7 = (ulong)uVar2;
                  pcVar9 = "sort";
                  uVar12 = 0xb9;
                  goto LAB_001011bd;
                }
                for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
                  *(REF_GLOB *)(sorted + lVar6 * 2) = global[(&m)[lVar6]];
                }
                uVar2 = ref_sort_search_glob(4,(REF_GLOB *)sorted,global[0],sorted_index);
                if (uVar2 != 0) {
                  uVar7 = (ulong)uVar2;
                  pcVar9 = "search";
                  uVar12 = 0xbd;
                  goto LAB_001011bd;
                }
                if ((&m)[sorted_index[0]] == 0) {
                  uVar2 = ref_sort_search_glob(4,(REF_GLOB *)sorted,global[1],sorted_index);
                  if (uVar2 != 0) {
                    uVar7 = (ulong)uVar2;
                    pcVar9 = "search";
                    uVar12 = 0xbf;
                    goto LAB_001011bd;
                  }
                  if ((&m)[sorted_index[0]] != 1) {
                    pcVar9 = "1";
                    uVar13 = 1;
                    uVar12 = 0xc0;
                    goto LAB_001012ee;
                  }
                  uVar2 = ref_sort_search_glob(4,(REF_GLOB *)sorted,global[2],sorted_index);
                  if (uVar2 != 0) {
                    uVar7 = (ulong)uVar2;
                    pcVar9 = "search";
                    uVar12 = 0xc1;
                    goto LAB_001011bd;
                  }
                  if ((&m)[sorted_index[0]] != 2) {
                    pcVar9 = "2";
                    uVar13 = 2;
                    uVar12 = 0xc2;
                    goto LAB_001012ee;
                  }
                  uVar2 = ref_sort_search_glob(4,(REF_GLOB *)sorted,global[3],sorted_index);
                  if (uVar2 != 0) {
                    uVar7 = (ulong)uVar2;
                    pcVar9 = "search";
                    uVar12 = 0xc3;
                    goto LAB_001011bd;
                  }
                  if ((&m)[sorted_index[0]] != 3) {
                    pcVar9 = "3";
                    uVar13 = 3;
                    uVar12 = 0xc4;
                    goto LAB_001012ee;
                  }
                  global[0] = 10;
                  global[1] = 0x14;
                  global[2] = 0x1e;
                  global[3] = 0x28;
                  uVar2 = ref_sort_search_glob(4,global,10,sorted);
                  if (uVar2 != 0) {
                    uVar7 = (ulong)uVar2;
                    pcVar9 = "search";
                    uVar12 = 0xd0;
                    goto LAB_001011bd;
                  }
                  if (sorted[0] == 0) {
                    uVar2 = ref_sort_search_glob(4,global,global[1],sorted);
                    if (uVar2 != 0) {
                      uVar7 = (ulong)uVar2;
                      pcVar9 = "search";
                      uVar12 = 0xd3;
                      goto LAB_001011bd;
                    }
                    if (sorted[0] != 1) {
                      pcVar9 = "1";
                      uVar13 = 1;
                      uVar12 = 0xd4;
                      goto LAB_001012ee;
                    }
                    uVar2 = ref_sort_search_glob(4,global,global[2],sorted);
                    if (uVar2 != 0) {
                      uVar7 = (ulong)uVar2;
                      pcVar9 = "search";
                      uVar12 = 0xd6;
                      goto LAB_001011bd;
                    }
                    if (sorted[0] != 2) {
                      pcVar9 = "2";
                      uVar13 = 2;
                      uVar12 = 0xd7;
                      goto LAB_001012ee;
                    }
                    uVar2 = ref_sort_search_glob(4,global,global[3],sorted);
                    if (uVar2 != 0) {
                      uVar7 = (ulong)uVar2;
                      pcVar9 = "search";
                      uVar12 = 0xd9;
                      goto LAB_001011bd;
                    }
                    if (sorted[0] == 3) {
                      RVar4 = ref_sort_search_glob(4,global,0,sorted);
                      if (RVar4 != 5) {
                        pcVar9 = "search";
                        uVar13 = 5;
                        uVar12 = 0xdd;
                        goto LAB_001012ee;
                      }
                      if (sorted[0] != -1) {
                        pcVar9 = "0";
                        uVar13 = 0xffffffffffffffff;
                        uVar12 = 0xde;
                        goto LAB_001012ee;
                      }
                      RVar4 = ref_sort_search_glob(4,global,0xf,sorted);
                      if (RVar4 != 5) {
                        pcVar9 = "search";
                        uVar13 = 5;
                        uVar12 = 0xe0;
                        goto LAB_001012ee;
                      }
                      if (sorted[0] != -1) {
                        pcVar9 = "15";
                        uVar13 = 0xffffffffffffffff;
                        uVar12 = 0xe1;
                        goto LAB_001012ee;
                      }
                      RVar4 = ref_sort_search_glob(4,global,0x32,sorted);
                      if (RVar4 != 5) {
                        pcVar9 = "search";
                        uVar13 = 5;
                        uVar12 = 0xe3;
                        goto LAB_001012ee;
                      }
                      if (sorted[0] != -1) {
                        pcVar9 = "50";
                        uVar13 = 0xffffffffffffffff;
                        uVar12 = 0xe4;
                        goto LAB_001012ee;
                      }
                      global[0] = global[0] & 0xffffffff00000000;
                      RVar4 = ref_sort_search_glob(0,(REF_GLOB *)0x0,0x11,(REF_INT *)global);
                      if (RVar4 != 5) {
                        pcVar9 = "search";
                        uVar13 = 5;
                        uVar12 = 0xed;
                        goto LAB_001012ee;
                      }
                      if ((int)global[0] != -1) {
                        pcVar9 = "0";
                        uVar13 = 0xffffffffffffffff;
                        uVar12 = 0xee;
                        goto LAB_001012ee;
                      }
                      sorted._0_8_ = sorted._0_8_ & 0xffffffff00000000;
                      global[2] = 0x3ff0000000000000;
                      global[3] = 0x4000000000000000;
                      global[0] = 0;
                      global[1] = 0x3fe0000000000000;
                      RVar4 = ref_sort_search_dbl(0,(REF_DBL *)global,-1.0,sorted);
                      if (RVar4 != 5) {
                        pcVar9 = "search";
                        uVar13 = 5;
                        uVar12 = 0xf6;
                        goto LAB_001012ee;
                      }
                      if (sorted[0] != -1) {
                        pcVar9 = "under";
                        uVar13 = 0xffffffffffffffff;
                        uVar12 = 0xf7;
                        goto LAB_001012ee;
                      }
                      uVar2 = ref_sort_search_dbl(1,(REF_DBL *)global,-1.0,sorted);
                      if (uVar2 != 0) {
                        pcVar9 = "search";
                        uVar12 = 0xf9;
LAB_00102fd8:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                               ,uVar12,"main",(ulong)uVar2,pcVar9);
                        return uVar2;
                      }
                      if (sorted[0] == 0) {
                        uVar2 = ref_sort_search_dbl(1,(REF_DBL *)global,0.0,sorted);
                        if (uVar2 != 0) {
                          pcVar9 = "search";
                          uVar12 = 0xfb;
                          goto LAB_00102fd8;
                        }
                        if (sorted[0] == 0) {
                          uVar2 = ref_sort_search_dbl(1,(REF_DBL *)global,1.0,sorted);
                          if (uVar2 != 0) {
                            pcVar9 = "search";
                            uVar12 = 0xfd;
                            goto LAB_00102fd8;
                          }
                          if (sorted[0] == 0) {
                            uVar2 = ref_sort_search_dbl(2,(REF_DBL *)global,-1.0,sorted);
                            if (uVar2 != 0) {
                              pcVar9 = "search";
                              uVar12 = 0x100;
                              goto LAB_00102fd8;
                            }
                            if (sorted[0] == 0) {
                              uVar2 = ref_sort_search_dbl(2,(REF_DBL *)global,0.0,sorted);
                              if (uVar2 != 0) {
                                pcVar9 = "search";
                                uVar12 = 0x102;
                                goto LAB_00102fd8;
                              }
                              if (sorted[0] == 0) {
                                uVar2 = ref_sort_search_dbl(2,(REF_DBL *)global,0.1,sorted);
                                if (uVar2 != 0) {
                                  pcVar9 = "search";
                                  uVar12 = 0x104;
                                  goto LAB_00102fd8;
                                }
                                if (sorted[0] == 0) {
                                  uVar2 = ref_sort_search_dbl(2,(REF_DBL *)global,0.5,sorted);
                                  if (uVar2 != 0) {
                                    pcVar9 = "search";
                                    uVar12 = 0x106;
                                    goto LAB_00102fd8;
                                  }
                                  if (sorted[0] == 0) {
                                    uVar2 = ref_sort_search_dbl(2,(REF_DBL *)global,1.0,sorted);
                                    if (uVar2 != 0) {
                                      pcVar9 = "search";
                                      uVar12 = 0x108;
                                      goto LAB_00102fd8;
                                    }
                                    if (sorted[0] == 0) {
                                      uVar2 = ref_sort_search_dbl(4,(REF_DBL *)global,-1.0,sorted);
                                      if (uVar2 != 0) {
                                        pcVar9 = "search";
                                        uVar12 = 0x10b;
                                        goto LAB_00102fd8;
                                      }
                                      if (sorted[0] == 0) {
                                        uVar2 = ref_sort_search_dbl(4,(REF_DBL *)global,0.1,sorted);
                                        if (uVar2 != 0) {
                                          pcVar9 = "search";
                                          uVar12 = 0x10d;
                                          goto LAB_00102fd8;
                                        }
                                        if (sorted[0] == 0) {
                                          uVar2 = ref_sort_search_dbl(4,(REF_DBL *)global,0.5,sorted
                                                                     );
                                          if (uVar2 != 0) {
                                            pcVar9 = "search";
                                            uVar12 = 0x10f;
                                            goto LAB_00102fd8;
                                          }
                                          if (sorted[0] != 1) {
                                            pcVar9 = "only";
                                            uVar13 = 1;
                                            uVar12 = 0x110;
                                            goto LAB_00103059;
                                          }
                                          uVar2 = ref_sort_search_dbl(4,(REF_DBL *)global,1.0,sorted
                                                                     );
                                          if (uVar2 != 0) {
                                            pcVar9 = "search";
                                            uVar12 = 0x111;
                                            goto LAB_00102fd8;
                                          }
                                          if (sorted[0] != 2) {
                                            pcVar9 = "only";
                                            uVar13 = 2;
                                            uVar12 = 0x112;
                                            goto LAB_00103059;
                                          }
                                          uVar2 = ref_sort_search_dbl(4,(REF_DBL *)global,1.5,sorted
                                                                     );
                                          if (uVar2 != 0) {
                                            pcVar9 = "search";
                                            uVar12 = 0x113;
                                            goto LAB_00102fd8;
                                          }
                                          if (sorted[0] != 2) {
                                            pcVar9 = "only";
                                            uVar13 = 2;
                                            uVar12 = 0x114;
                                            goto LAB_00103059;
                                          }
                                          uVar2 = ref_sort_search_dbl(4,(REF_DBL *)global,5.0,sorted
                                                                     );
                                          if (uVar2 != 0) {
                                            pcVar9 = "search";
                                            uVar12 = 0x115;
                                            goto LAB_00102fd8;
                                          }
                                          if (sorted[0] != 2) {
                                            pcVar9 = "only";
                                            uVar13 = 2;
                                            uVar12 = 0x116;
                                            goto LAB_00103059;
                                          }
                                          global[0] = CONCAT44(global[0]._4_4_,1);
                                          sorted[0] = 2;
                                          uVar2 = ref_sort_heap_int(0,(REF_INT *)global,sorted);
                                          if (uVar2 != 0) {
                                            pcVar9 = "sort";
                                            uVar12 = 0x11d;
                                            goto LAB_00102fd8;
                                          }
                                          if (sorted[0] != 2) {
                                            pcVar9 = "sorted_index[0]";
                                            uVar13 = 2;
                                            uVar12 = 0x11e;
                                            goto LAB_00103059;
                                          }
                                          global[0] = CONCAT44(global[0]._4_4_,1);
                                          sorted[0] = 2;
                                          uVar2 = ref_sort_heap_int(1,(REF_INT *)global,sorted);
                                          if (uVar2 != 0) {
                                            pcVar9 = "sort";
                                            uVar12 = 0x125;
                                            goto LAB_00102fd8;
                                          }
                                          if (sorted[0] == 0) {
                                            global[0] = 0x200000001;
                                            uVar2 = ref_sort_heap_int(2,(REF_INT *)global,sorted);
                                            if (uVar2 != 0) {
                                              pcVar9 = "sort";
                                              uVar12 = 0x12d;
                                              goto LAB_00102fd8;
                                            }
                                            if (sorted[0] == 0) {
                                              if (sorted[1] != 1) {
                                                pcVar9 = "sorted_index[1]";
                                                uVar13 = 1;
                                                uVar12 = 0x12f;
                                                goto LAB_00103059;
                                              }
                                              global[0] = 0x100000002;
                                              uVar2 = ref_sort_heap_int(2,(REF_INT *)global,sorted);
                                              if (uVar2 != 0) {
                                                pcVar9 = "sort";
                                                uVar12 = 0x136;
                                                goto LAB_00102fd8;
                                              }
                                              if (sorted[0] != 1) {
                                                pcVar9 = "sorted_index[0]";
                                                uVar13 = 1;
                                                uVar12 = 0x137;
                                                goto LAB_00103059;
                                              }
                                              if (sorted[1] == 0) {
                                                global[0] = 0x100000000;
                                                global[1] = CONCAT44(global[1]._4_4_,2);
                                                uVar2 = ref_sort_heap_int(3,(REF_INT *)global,sorted
                                                                         );
                                                if (uVar2 != 0) {
                                                  pcVar9 = "sort";
                                                  uVar12 = 0x140;
                                                  goto LAB_00102fd8;
                                                }
                                                if (sorted[0] == 0) {
                                                  if (sorted[1] != 1) {
                                                    pcVar9 = "sorted_index[1]";
                                                    uVar13 = 1;
                                                    uVar12 = 0x142;
                                                    goto LAB_00103059;
                                                  }
                                                  if (sorted[2] != 2) {
                                                    pcVar9 = "sorted_index[2]";
                                                    uVar13 = 2;
                                                    uVar12 = 0x143;
                                                    goto LAB_00103059;
                                                  }
                                                  global[0] = 2;
                                                  global[1] = CONCAT44(global[1]._4_4_,1);
                                                  uVar2 = ref_sort_heap_int(3,(REF_INT *)global,
                                                                            sorted);
                                                  if (uVar2 != 0) {
                                                    pcVar9 = "sort";
                                                    uVar12 = 0x14b;
                                                    goto LAB_00102fd8;
                                                  }
                                                  if (sorted[0] != 1) {
                                                    pcVar9 = "sorted_index[0]";
                                                    uVar13 = 1;
                                                    uVar12 = 0x14c;
                                                    goto LAB_00103059;
                                                  }
                                                  if (sorted[1] != 2) {
                                                    pcVar9 = "sorted_index[1]";
                                                    uVar13 = 2;
                                                    uVar12 = 0x14d;
                                                    goto LAB_00103059;
                                                  }
                                                  if (sorted[2] == 0) {
                                                    global[0] = 0;
                                                    global[1] = 0x401c000000000000;
                                                    global[2] = 0x4008000000000000;
                                                    global[3] = -0x4010000000000000;
                                                    uVar2 = ref_sort_heap_dbl(4,(REF_DBL *)global,
                                                                              sorted);
                                                    if (uVar2 != 0) {
                                                      pcVar9 = "sort";
                                                      uVar12 = 0x159;
                                                      goto LAB_00102fd8;
                                                    }
                                                    if (sorted[0] != 3) {
                                                      pcVar9 = "sorted_index[0]";
                                                      uVar13 = 3;
                                                      uVar12 = 0x15a;
                                                      goto LAB_00103059;
                                                    }
                                                    if (sorted[1] == 0) {
                                                      if (sorted[2] != 2) {
                                                        pcVar9 = "sorted_index[2]";
                                                        uVar13 = 2;
                                                        uVar12 = 0x15c;
                                                        goto LAB_00103059;
                                                      }
                                                      if (sorted[3] != 1) {
                                                        pcVar9 = "sorted_index[3]";
                                                        uVar13 = 1;
                                                        uVar12 = 0x15d;
                                                        goto LAB_00103059;
                                                      }
                                                      for (lVar6 = 0; lVar6 != 0x10;
                                                          lVar6 = lVar6 + 1) {
                                                        *(undefined4 *)((long)global + lVar6 * 4) =
                                                             0;
                                                      }
                                                      iVar10 = 1000000;
                                                      while (bVar11 = iVar10 != 0,
                                                            iVar10 = iVar10 + -1, bVar11) {
                                                        RVar5 = ref_sort_rand_in_range(1,0xe);
                                                        piVar1 = (int *)((long)global +
                                                                        (long)RVar5 * 4);
                                                        *piVar1 = *piVar1 + 1;
                                                      }
                                                      if ((int)global[0] == 0) {
                                                        if (global[0]._4_4_ == 0) {
                                                          pcVar9 = "zero min";
                                                          uVar12 = 0x16a;
LAB_00102f93:
                                                          printf("%s: %d: %s: %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,uVar12,"main",pcVar9);
                                                  return 1;
                                                  }
                                                  if (in_stack_ffffffffffc2f720 == 0) {
                                                    pcVar9 = "zero max";
                                                    uVar12 = 0x16b;
                                                    goto LAB_00102f93;
                                                  }
                                                  if (in_stack_ffffffffffc2f724 == 0) {
                                                    uVar2 = ref_sort_shuffle(1000000,(REF_INT *)
                                                                                     global);
                                                    if (uVar2 != 0) {
                                                      pcVar9 = "shuffle";
                                                      uVar12 = 0x172;
                                                      goto LAB_00102fd8;
                                                    }
                                                    for (lVar6 = 0; lVar6 != 1000000;
                                                        lVar6 = lVar6 + 1) {
                                                      sorted[lVar6] = 0;
                                                    }
                                                    for (lVar6 = 0; lVar6 != 1000000;
                                                        lVar6 = lVar6 + 1) {
                                                      sorted[*(int *)((long)global + lVar6 * 4)] =
                                                           sorted[*(int *)((long)global + lVar6 * 4)
                                                                 ] + 1;
                                                    }
                                                    lVar6 = 0;
                                                    do {
                                                      if (lVar6 == 1000000) {
                                                        return 0;
                                                      }
                                                      piVar1 = sorted + lVar6;
                                                      lVar6 = lVar6 + 1;
                                                    } while (*piVar1 == 1);
                                                    pcVar9 = "missing/dup entry";
                                                    uVar13 = 1;
                                                    uVar12 = 0x175;
                                                    goto LAB_00103059;
                                                  }
                                                  pcVar9 = "max off-by-one";
                                                  uVar12 = 0x16c;
                                                  }
                                                  else {
                                                    pcVar9 = "min off-by-one";
                                                    uVar12 = 0x169;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "sorted_index[1]";
                                                    uVar12 = 0x15b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar9 = "sorted_index[2]";
                                                    uVar12 = 0x14e;
                                                  }
                                                }
                                                else {
                                                  pcVar9 = "sorted_index[0]";
                                                  uVar12 = 0x141;
                                                }
                                              }
                                              else {
                                                pcVar9 = "sorted_index[1]";
                                                uVar12 = 0x138;
                                              }
                                            }
                                            else {
                                              pcVar9 = "sorted_index[0]";
                                              uVar12 = 0x12e;
                                            }
                                          }
                                          else {
                                            pcVar9 = "sorted_index[0]";
                                            uVar12 = 0x126;
                                          }
                                        }
                                        else {
                                          pcVar9 = "only";
                                          uVar12 = 0x10e;
                                        }
                                      }
                                      else {
                                        pcVar9 = "only";
                                        uVar12 = 0x10c;
                                      }
                                    }
                                    else {
                                      pcVar9 = "only";
                                      uVar12 = 0x109;
                                    }
                                  }
                                  else {
                                    pcVar9 = "only";
                                    uVar12 = 0x107;
                                  }
                                }
                                else {
                                  pcVar9 = "only";
                                  uVar12 = 0x105;
                                }
                              }
                              else {
                                pcVar9 = "only";
                                uVar12 = 0x103;
                              }
                            }
                            else {
                              pcVar9 = "only";
                              uVar12 = 0x101;
                            }
                          }
                          else {
                            pcVar9 = "only";
                            uVar12 = 0xfe;
                          }
                        }
                        else {
                          pcVar9 = "only";
                          uVar12 = 0xfc;
                        }
                      }
                      else {
                        pcVar9 = "only";
                        uVar12 = 0xfa;
                      }
                      uVar13 = 0;
LAB_00103059:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                             ,uVar12,"main",pcVar9,uVar13);
                      return 1;
                    }
                    pcVar9 = "3";
                    uVar13 = 3;
                    uVar12 = 0xda;
                    goto LAB_001012ee;
                  }
                  uVar12 = 0xd1;
                }
                else {
                  uVar12 = 0xbe;
                }
              }
              else {
                uVar12 = 0xa9;
              }
              pcVar9 = "0";
              uVar13 = 0;
              goto LAB_001012ee;
            }
            pcVar9 = "unique[2]";
            uVar12 = 0x4d;
          }
          else {
            pcVar9 = "m";
            uVar12 = 0x4a;
          }
        }
        else {
          pcVar9 = "sorted[2]";
          uVar12 = 0x3f;
        }
      }
      else {
        pcVar9 = "sorted[2]";
        uVar12 = 0x32;
      }
    }
    else {
      pcVar9 = "sorted[2]";
      uVar12 = 0x25;
    }
    uVar13 = 3;
  }
  else {
    pcVar9 = "sorted[0]";
    uVar12 = 0x23;
LAB_00101274:
    uVar13 = 1;
  }
LAB_001012ee:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
         uVar12,"main",pcVar9,uVar13);
  return 1;
}

Assistant:

int main(void) {
  { /* insert sort ordered */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 1;
    original[1] = 2;
    original[2] = 3;
    original[3] = 4;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* insert sort flip */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 4;
    original[1] = 3;
    original[2] = 2;
    original[3] = 1;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* insert sort flip flip */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 2;
    original[1] = 1;
    original[2] = 4;
    original[3] = 3;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* unique */
    REF_INT n = 4, original[4], m, unique[4];
    original[0] = 2;
    original[1] = 1;
    original[2] = 2;
    original[3] = 3;
    RSS(ref_sort_unique_int(n, original, &m, unique), "unique");
    REIS(3, m, "m");
    REIS(1, unique[0], "unique[0]");
    REIS(2, unique[1], "unique[1]");
    REIS(3, unique[2], "unique[2]");
  }

  { /* same */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 0;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(same, "same");
  }
  { /* same */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 4;
    list0[1] = 7;
    list0[2] = 6;
    list0[3] = 5;

    list1[0] = 4;
    list1[1] = 7;
    list1[2] = 6;
    list1[3] = 5;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(same, "same");
  }

  { /* same repeat */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 3;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(!same, "same");
  }

  { /* same diff */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 5;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(!same, "same");
  }

  { /* sparse global to local */
    REF_INT n = 7, i;
    REF_GLOB global[7], sorted_global[7];
    REF_INT pack[7], sorted_index[7], position, total;
    global[0] = 10;
    global[1] = REF_EMPTY;
    global[2] = 30;
    global[3] = REF_EMPTY;
    global[4] = REF_EMPTY;
    global[5] = 20;
    global[6] = REF_EMPTY;
    total = 0;
    for (i = 0; i < n; i++) {
      if (REF_EMPTY != global[i]) {
        sorted_global[total] = global[i];
        pack[total] = i;
        total++;
      }
    }
    RSS(ref_sort_heap_glob(total, sorted_global, sorted_index), "sort");
    for (i = 0; i < total; i++) {
      sorted_index[i] = pack[sorted_index[i]];
      sorted_global[i] = global[sorted_index[i]];
    }
    RSS(ref_sort_search_glob(total, sorted_global, global[0], &position),
        "search");
    REIS(0, sorted_index[position], "0");
    RSS(ref_sort_search_glob(total, sorted_global, global[2], &position),
        "search");
    REIS(2, sorted_index[position], "2");
    RSS(ref_sort_search_glob(total, sorted_global, global[5], &position),
        "search");
    REIS(5, sorted_index[position], "5");
  }

  { /* dense global to local */
    REF_GLOB global[4], sorted_global[4];
    REF_INT n = 4, i, sorted_index[4], position;
    global[0] = 40;
    global[1] = 10;
    global[2] = 30;
    global[3] = 20;
    RSS(ref_sort_heap_glob(n, global, sorted_index), "sort");
    for (i = 0; i < n; i++) {
      sorted_global[i] = global[sorted_index[i]];
    }
    RSS(ref_sort_search_glob(n, sorted_global, global[0], &position), "search");
    REIS(0, sorted_index[position], "0");
    RSS(ref_sort_search_glob(n, sorted_global, global[1], &position), "search");
    REIS(1, sorted_index[position], "1");
    RSS(ref_sort_search_glob(n, sorted_global, global[2], &position), "search");
    REIS(2, sorted_index[position], "2");
    RSS(ref_sort_search_glob(n, sorted_global, global[3], &position), "search");
    REIS(3, sorted_index[position], "3");
  }

  { /* search */
    REF_INT n = 4, position;
    REF_GLOB ascending_list[4];
    ascending_list[0] = 10;
    ascending_list[1] = 20;
    ascending_list[2] = 30;
    ascending_list[3] = 40;

    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[0], &position),
        "search");
    REIS(0, position, "0");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[1], &position),
        "search");
    REIS(1, position, "1");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[2], &position),
        "search");
    REIS(2, position, "2");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[3], &position),
        "search");
    REIS(3, position, "3");

    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 0, &position),
         "search");
    REIS(REF_EMPTY, position, "0");
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 15, &position),
         "search");
    REIS(REF_EMPTY, position, "15");
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 50, &position),
         "search");
    REIS(REF_EMPTY, position, "50");
  }

  { /* search 0 */
    REF_INT n = 0, position;
    REF_GLOB *ascending_list = NULL;

    position = 0;
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 17, &position),
         "search");
    REIS(REF_EMPTY, position, "0");
  }

  { /* search dbl */
    REF_INT n = 4, position = 0;
    REF_DBL ascending_list[] = {0.0, 0.5, 1.0, 2.0};

    REIS(REF_NOT_FOUND, ref_sort_search_dbl(0, ascending_list, -1.0, &position),
         "search");
    REIS(REF_EMPTY, position, "under");

    RSS(ref_sort_search_dbl(1, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(1, ascending_list, 0.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(1, ascending_list, 1.0, &position), "search");
    REIS(0, position, "only");

    RSS(ref_sort_search_dbl(2, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.1, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.5, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 1.0, &position), "search");
    REIS(0, position, "only");

    RSS(ref_sort_search_dbl(n, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 0.1, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 0.5, &position), "search");
    REIS(1, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 1.0, &position), "search");
    REIS(2, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 1.5, &position), "search");
    REIS(2, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 5.0, &position), "search");
    REIS(2, position, "only");
  }

  { /* heap sort zero int */
    REF_INT n = 0, original[1], sorted_index[1];
    original[0] = 1;
    sorted_index[0] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(2, sorted_index[0], "sorted_index[0]");
  }

  { /* heap sort one int */
    REF_INT n = 1, original[1], sorted_index[1];
    original[0] = 1;
    sorted_index[0] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
  }

  { /* heap two order int */
    REF_INT n = 2, original[2], sorted_index[2];
    original[0] = 1;
    original[1] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
    REIS(1, sorted_index[1], "sorted_index[1]");
  }

  { /* heap two reversed int */
    REF_INT n = 2, original[2], sorted_index[2];
    original[0] = 2;
    original[1] = 1;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(1, sorted_index[0], "sorted_index[0]");
    REIS(0, sorted_index[1], "sorted_index[1]");
  }

  { /* heap three 012 int */
    REF_INT n = 3, original[3], sorted_index[3];
    original[0] = 0;
    original[1] = 1;
    original[2] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
    REIS(1, sorted_index[1], "sorted_index[1]");
    REIS(2, sorted_index[2], "sorted_index[2]");
  }

  { /* heap three 120 int */
    REF_INT n = 3, original[3], sorted_index[3];
    original[0] = 2;
    original[1] = 0;
    original[2] = 1;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(1, sorted_index[0], "sorted_index[0]");
    REIS(2, sorted_index[1], "sorted_index[1]");
    REIS(0, sorted_index[2], "sorted_index[2]");
  }

  { /* heap dbl */
    REF_INT n = 4;
    REF_DBL original[4];
    REF_INT sorted_index[4];
    original[0] = 0.0;
    original[1] = 7.0;
    original[2] = 3.0;
    original[3] = -1.0;
    RSS(ref_sort_heap_dbl(n, original, sorted_index), "sort");
    REIS(3, sorted_index[0], "sorted_index[0]");
    REIS(0, sorted_index[1], "sorted_index[1]");
    REIS(2, sorted_index[2], "sorted_index[2]");
    REIS(1, sorted_index[3], "sorted_index[3]");
  }

  { /* rand range */
    REF_INT min = 1, max = 14;
    REF_INT count[16], m = 16;
    REF_INT i, j, n = 1000000;
    for (j = 0; j < m; j++) count[j] = 0;
    for (i = 0; i < n; i++) {
      j = ref_sort_rand_in_range(min, max);
      count[j]++;
    }
    REIS(0, count[min - 1], "min off-by-one");
    RAS(0 != count[min], "zero min");
    RAS(0 != count[max], "zero max");
    REIS(0, count[max + 1], "max off-by-one");
  }

  { /* rand range */
    REF_INT n = 1000000, permutation[1000000], count[1000000];
    REF_INT i;
    RSS(ref_sort_shuffle(n, permutation), "shuffle");
    for (i = 0; i < n; i++) count[i] = 0;
    for (i = 0; i < n; i++) count[permutation[i]]++;
    for (i = 0; i < n; i++) REIS(1, count[i], "missing/dup entry");
  }

  return 0;
}